

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O2

BoundingBox * __thiscall
draco::PointCloud::ComputeBoundingBox(BoundingBox *__return_storage_ptr__,PointCloud *this)

{
  size_t __n;
  PointAttribute *pPVar1;
  AttributeValueIndex i;
  ulong uVar2;
  Vector3f p;
  VectorD<float,_3> local_2c;
  
  BoundingBox::BoundingBox(__return_storage_ptr__);
  pPVar1 = GetNamedAttribute(this,POSITION);
  if (pPVar1 != (PointAttribute *)0x0) {
    VectorD<float,_3>::VectorD(&local_2c);
    for (uVar2 = 0; uVar2 < pPVar1->num_unique_entries_; uVar2 = uVar2 + 1) {
      __n = (pPVar1->super_GeometryAttribute).byte_stride_;
      memcpy(&local_2c,
             (void *)((long)(((pPVar1->super_GeometryAttribute).buffer_)->data_).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                      (pPVar1->super_GeometryAttribute).byte_offset_ + __n * uVar2),__n);
      BoundingBox::Update(__return_storage_ptr__,&local_2c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundingBox PointCloud::ComputeBoundingBox() const {
  BoundingBox bounding_box;
  auto pc_att = GetNamedAttribute(GeometryAttribute::POSITION);
  if (pc_att == nullptr) {
    // Return default invalid bounding box.
    return bounding_box;
  }

  // TODO(b/199760503): Make the BoundingBox a template type, it may not be easy
  // because PointCloud is not a template.
  // Or simply add some preconditioning here to make sure the position attribute
  // is valid, because the current code works only if the position attribute is
  // defined with 3 components of DT_FLOAT32.
  // Consider using pc_att->ConvertValue<float, 3>(i, &p[0]) (Enforced
  // transformation from Vector with any dimension to Vector3f)
  Vector3f p;
  for (AttributeValueIndex i(0); i < static_cast<uint32_t>(pc_att->size());
       ++i) {
    pc_att->GetValue(i, &p[0]);
    bounding_box.Update(p);
  }
  return bounding_box;
}